

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

FFSEncodeVector FFSencode_vector(FFSBuffer b,FMFormat_conflict fmformat,void *data)

{
  int iVar1;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  int64_t record_len;
  char *tmp_data;
  ssize_t header_size;
  ssize_t base_offset;
  encode_state state;
  addr_list_entry stack_addr_list [100];
  internal_iovec stack_iov_array [100];
  int64_t in_stack_ffffffffffffefd0;
  FFSBuffer in_stack_ffffffffffffefd8;
  estate peVar2;
  int iVar3;
  uint in_stack_ffffffffffffefec;
  FMFormat_conflict in_stack_ffffffffffffeff0;
  FMFormat_conflict p_Var4;
  int iVar5;
  int in_stack_ffffffffffffeffc;
  encode_state *s;
  int local_fec;
  undefined8 local_fc8 [200];
  encode_state local_988 [30];
  undefined8 local_20;
  long local_18;
  long *local_10;
  FFSEncodeVector local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  init_encode_state((estate)&stack0xffffffffffffefe8);
  peVar2 = (estate)0x0;
  iVar5 = 1;
  s = local_988;
  iVar3 = 0;
  make_tmp_buffer(in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0);
  iVar1 = (int)((ulong)in_stack_ffffffffffffefd0 >> 0x20);
  setup_header((FFSBuffer)in_stack_ffffffffffffeff0,
               (FMFormat_conflict)CONCAT44(in_stack_ffffffffffffefec,iVar3),peVar2);
  p_Var4 = in_stack_ffffffffffffeff0;
  if ((*(int *)(local_18 + 0x48) == 0) && (iVar3 == 0)) {
    peVar2 = (estate)add_data_iovec((estate)in_stack_ffffffffffffeff0,
                                    (FFSBuffer)((ulong)in_stack_ffffffffffffefec << 0x20),peVar2,
                                    (size_t)in_stack_ffffffffffffeff0,iVar1);
  }
  else {
    peVar2 = (estate)copy_data_to_tmp(s,(FFSBuffer)CONCAT44(in_stack_ffffffffffffeffc,iVar5),
                                      in_stack_ffffffffffffeff0,
                                      CONCAT44(in_stack_ffffffffffffefec,iVar3),
                                      (int)((ulong)peVar2 >> 0x20),
                                      (size_t *)in_stack_ffffffffffffeff0);
    if (peVar2 == (estate)0xffffffffffffffff) {
      return (FFSEncodeVector)0x0;
    }
  }
  if (*(int *)(local_18 + 0x48) == 0) {
    local_8 = fixup_output_vector((FFSBuffer)CONCAT44(in_stack_ffffffffffffefec,iVar3),peVar2);
  }
  else {
    if (*(int *)(local_18 + 0x4c) != 0) {
      local_fc8[(long)local_fec * 2] = local_20;
      local_fc8[(long)local_fec * 2 + 1] = peVar2;
    }
    copy_data_to_tmp(s,(FFSBuffer)CONCAT44(in_stack_ffffffffffffeffc,iVar5),p_Var4,
                     CONCAT44(in_stack_ffffffffffffefec,iVar3),(int)((ulong)peVar2 >> 0x20),
                     (size_t *)in_stack_ffffffffffffeff0);
    iVar1 = handle_subfields((FFSBuffer)CONCAT44(in_stack_ffffffffffffeffc,iVar5),p_Var4,
                             (estate)CONCAT44(in_stack_ffffffffffffefec,iVar3),(size_t)peVar2);
    if (iVar1 == 0) {
      local_8 = (FFSEncodeVector)0x0;
    }
    else {
      *(long *)(*local_10 + (long)*(int *)(local_18 + 0x20)) =
           (long)p_Var4 - (long)in_stack_ffffffffffffeff0;
      free_addr_list((estate)0x10e756);
      local_8 = fixup_output_vector((FFSBuffer)CONCAT44(in_stack_ffffffffffffefec,iVar3),peVar2);
    }
  }
  return local_8;
}

Assistant:

FFSEncodeVector
FFSencode_vector(FFSBuffer b, FMFormat fmformat, void *data)
{
    internal_iovec stack_iov_array[STACK_ARRAY_SIZE];
    addr_list_entry stack_addr_list[STACK_ARRAY_SIZE];
    struct encode_state state;
    init_encode_state(&state);
    ssize_t base_offset = 0;
    ssize_t header_size;

    state.iovec_is_stack = 1;
    state.iovec = stack_iov_array;
    state.addr_list_is_stack = 1;
    state.addr_list = stack_addr_list;
    state.copy_all = 0;
    state.saved_offset_difference = 0;
    state.orig_data = data;

    make_tmp_buffer(b, 0);

    /* setup header information */
    setup_header(b, fmformat, &state);

    header_size = state.output_len;
    state.saved_offset_difference = header_size;

    if (fmformat->variant || state.copy_all) {
	base_offset = copy_data_to_tmp(&state, b, data, 
				       fmformat->record_length, 1, NULL);
	if (base_offset == -1) return NULL;
    } else if (!state.copy_all) {
	base_offset = add_data_iovec(&state, b, data, 
				     fmformat->record_length, 1);
    }
    if (!fmformat->variant) {
	return fixup_output_vector(b, &state);
    }

    if (fmformat->recursive) {
	state.addr_list[state.addr_list_cnt].addr = data;
	state.addr_list[state.addr_list_cnt].offset = base_offset;
	state.addr_list_cnt++;
    }

    copy_data_to_tmp(&state, b, NULL, 0, 8, NULL);   /* force 64-bit align for var */

    if (!handle_subfields(b, fmformat, &state, base_offset)) return NULL;
    {
	/* fill in actual length of data marshalled after header */
	char *tmp_data = b->tmp_buffer;
	int64_t record_len = state.output_len - header_size;
	tmp_data += fmformat->server_ID.length;
	memcpy(tmp_data, &record_len, 8);
    }
    free_addr_list(&state);
    return fixup_output_vector(b, &state);
}